

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colony.cpp
# Opt level: O0

double __thiscall Colony::get_rand(Colony *this)

{
  result_type_conflict1 rVar1;
  uniform_real_distribution<double> distr;
  mt19937 generator;
  random_device rand_dev;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd8a8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd8b0;
  random_device *in_stack_ffffffffffffd8f0;
  
  std::random_device::random_device(in_stack_ffffffffffffd8f0);
  std::random_device::operator()((random_device *)0x10faeb);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            (in_stack_ffffffffffffd8b0,(result_type_conflict)in_stack_ffffffffffffd8a8);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)in_stack_ffffffffffffd8b0,
             (double)in_stack_ffffffffffffd8a8,5.49824906499598e-318);
  rVar1 = std::uniform_real_distribution<double>::operator()
                    ((uniform_real_distribution<double> *)in_stack_ffffffffffffd8b0,
                     in_stack_ffffffffffffd8a8);
  std::random_device::~random_device((random_device *)0x10fb40);
  return rVar1;
}

Assistant:

double Colony::get_rand() const
{
    std::random_device rand_dev;
    std::mt19937 generator(rand_dev());
    std::uniform_real_distribution<double> distr(0, 1);
    return distr(generator);
}